

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O0

size_t sysbvm_dwarf_encodeAlignment(sysbvm_dynarray_t *buffer,size_t alignment)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  ulong local_38;
  size_t i;
  size_t padding;
  size_t alignedSize;
  size_t offset;
  size_t alignment_local;
  sysbvm_dynarray_t *buffer_local;
  
  sVar1 = buffer->size;
  sVar2 = buffer->size;
  sVar3 = buffer->size;
  for (local_38 = 0; local_38 < ((sVar2 + alignment) - 1 & -alignment) - sVar3;
      local_38 = local_38 + 1) {
    sysbvm_dwarf_encodeByte(buffer,'\0');
  }
  return sVar1;
}

Assistant:

SYSBVM_API size_t sysbvm_dwarf_encodeAlignment(sysbvm_dynarray_t *buffer, size_t alignment)
{
    size_t offset = buffer->size;
    size_t alignedSize = (buffer->size + alignment - 1) & (-alignment);
    size_t padding = alignedSize - buffer->size;
    for(size_t i = 0; i < padding; ++i)
        sysbvm_dwarf_encodeByte(buffer, 0);
    return offset;
}